

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varmap.cc
# Opt level: O3

void __thiscall ScopeLocal::collectNameRecs(ScopeLocal *this)

{
  list<DynamicRecommend,_std::allocator<DynamicRecommend>_> *this_00;
  Symbol *this_01;
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_node_base *p_Var2;
  SymbolEntry *pSVar3;
  Range *pRVar4;
  mapped_type *pmVar5;
  _Self __tmp;
  Address usepoint;
  Address local_68;
  
  std::
  _Rb_tree<AddressUsePointPair,_std::pair<const_AddressUsePointPair,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_AddressUsePointPair,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<AddressUsePointPair>,_std::allocator<std::pair<const_AddressUsePointPair,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(this->nameRecommend)._M_t);
  this_00 = &this->dynRecommend;
  std::__cxx11::_List_base<DynamicRecommend,_std::allocator<DynamicRecommend>_>::_M_clear
            (&this_00->super__List_base<DynamicRecommend,_std::allocator<DynamicRecommend>_>);
  (this->dynRecommend).super__List_base<DynamicRecommend,_std::allocator<DynamicRecommend>_>._M_impl
  ._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->dynRecommend).super__List_base<DynamicRecommend,_std::allocator<DynamicRecommend>_>._M_impl
  ._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->dynRecommend).super__List_base<DynamicRecommend,_std::allocator<DynamicRecommend>_>._M_impl
  ._M_node._M_size = 0;
  p_Var1 = (this->super_ScopeInternal).nametree._M_t._M_impl.super__Rb_tree_header._M_header._M_left
  ;
  while ((_Rb_tree_header *)p_Var1 !=
         &(this->super_ScopeInternal).nametree._M_t._M_impl.super__Rb_tree_header) {
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
    this_01 = *(Symbol **)(p_Var1 + 1);
    p_Var1 = p_Var2;
    if (((this_01->flags & 0x300) == 0x200) &&
       (pSVar3 = Symbol::getFirstWholeMap(this_01), pSVar3 != (SymbolEntry *)0x0)) {
      if ((pSVar3->addr).base == (AddrSpace *)0x0) {
        SymbolEntry::getFirstUseAddress((SymbolEntry *)&stack0xffffffffffffffa8);
        addDynamicRecommend(this,(Address *)&stack0xffffffffffffffa8,pSVar3->hash,&this_01->name);
      }
      else {
        local_68.base = (AddrSpace *)0x0;
        if ((pSVar3->uselimit).tree._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          pRVar4 = RangeList::getFirstRange(&pSVar3->uselimit);
          local_68.base = pRVar4->spc;
          local_68.offset = pRVar4->first;
        }
        AddressUsePointPair::AddressUsePointPair
                  ((AddressUsePointPair *)&stack0xffffffffffffffa8,&pSVar3->addr,&local_68,
                   pSVar3->size);
        pmVar5 = std::
                 map<AddressUsePointPair,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<AddressUsePointPair>,_std::allocator<std::pair<const_AddressUsePointPair,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->nameRecommend,(AddressUsePointPair *)&stack0xffffffffffffffa8);
        std::__cxx11::string::_M_assign((string *)pmVar5);
      }
      if (this_01->category < 0) {
        (*(this->super_ScopeInternal).super_Scope._vptr_Scope[0x13])(this,this_01);
      }
    }
  }
  return;
}

Assistant:

void ScopeLocal::collectNameRecs(void)

{
  nameRecommend.clear();	// Clear out any old name recommendations
  dynRecommend.clear();

  SymbolNameTree::iterator iter = nametree.begin();
  while(iter!=nametree.end()) {
    Symbol *sym = *iter++;
    if (sym->isNameLocked()&&(!sym->isTypeLocked())) {
      SymbolEntry *entry = sym->getFirstWholeMap();
      if (entry != (SymbolEntry *)0) {
	if (entry->isDynamic()) {
	  addDynamicRecommend(entry->getFirstUseAddress(), entry->getHash(), sym->getName());
	}
	else {
	  Address usepoint;
	  if (!entry->getUseLimit().empty()) {
	    const Range *range = entry->getUseLimit().getFirstRange();
	    usepoint = Address(range->getSpace(),range->getFirst());
	  }
	  addRecommendName( entry->getAddr(), usepoint, sym->getName(), entry->getSize() );
	}
	if (sym->getCategory()<0)
	  removeSymbol(sym);
      }
    }
  }
}